

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O3

void __thiscall clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  
  pCVar2 = this->m_column;
  uVar8 = this->m_stringIndex;
  pbVar3 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar8) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Tests/ScsTest/../../External/Clara/clara.hpp"
                  ,0x6c,"void clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  uVar4 = this->m_pos;
  if ((uVar4 != 0 || uVar8 != 0) || (sVar11 = pCVar2->m_initialIndent, sVar11 == 0xffffffffffffffff)
     ) {
    sVar11 = pCVar2->m_indent;
  }
  sVar11 = pCVar2->m_width - sVar11;
  uVar5 = *(size_type *)((long)(pbVar3 + uVar8) + 8);
  this->m_end = uVar4;
  uVar9 = uVar4;
  if (uVar4 < uVar5) {
    lVar7 = *(long *)&pbVar3[uVar8]._M_dataplus;
    uVar8 = uVar4;
    do {
      uVar9 = uVar8;
      if (*(char *)(lVar7 + uVar8) == '\n') break;
      uVar8 = uVar8 + 1;
      this->m_end = uVar8;
      uVar9 = uVar5;
    } while (uVar5 != uVar8);
  }
  sVar10 = sVar11;
  if (uVar9 < sVar11 + uVar4) {
    sVar10 = uVar9 - uVar4;
    goto LAB_0010c078;
  }
  for (; sVar10 != 0; sVar10 = sVar10 - 1) {
    bVar6 = isBoundary(this,this->m_pos + sVar10);
    if (bVar6) goto LAB_0010c08c;
  }
  goto LAB_0010c06e;
  while (sVar10 = sVar10 - 1, sVar10 != 0) {
LAB_0010c08c:
    cVar1 = *(char *)((sVar10 - 1) +
                     *(long *)&(this->m_column->m_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                               _M_dataplus + this->m_pos);
    if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
      calcLength();
    }
    lVar7 = std::__cxx11::string::find('@',(ulong)(uint)(int)cVar1);
    if (lVar7 == -1) goto LAB_0010c078;
  }
LAB_0010c06e:
  this->m_suffix = true;
  sVar10 = sVar11 - 1;
LAB_0010c078:
  this->m_len = sVar10;
  return;
}

Assistant:

void calcLength() {
                assert( m_stringIndex < m_column.m_strings.size() );

                m_suffix = false;
                auto width = m_column.m_width-indent();
                m_end = m_pos;
                while( m_end < line().size() && line()[m_end] != '\n' )
                    ++m_end;

                if( m_end < m_pos + width ) {
                    m_len = m_end - m_pos;
                }
                else {
                    size_t len = width;
                    while (len > 0 && !isBoundary(m_pos + len))
                        --len;
                    while (len > 0 && isWhitespace( line()[m_pos + len - 1] ))
                        --len;

                    if (len > 0) {
                        m_len = len;
                    } else {
                        m_suffix = true;
                        m_len = width - 1;
                    }
                }
            }